

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_impl.hpp
# Opt level: O0

void __thiscall
type_safe::detail::
swap_union<type_safe::optional_variant_policy,type_safe::tagged_union<int,double,debugger_type>>::
visitor::operator()(visitor *this,int *param_1,tagged_union<int,_double,_debugger_type> *a,
                   tagged_union<int,_double,_debugger_type> *b)

{
  type_id tVar1;
  bool bVar2;
  equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *lhs;
  int *__b;
  int *piVar3;
  union_type<int> local_72;
  union_type<int> local_71;
  int local_70;
  union_type<int> local_6c;
  union_type<int> local_6b [3];
  int tmp;
  undefined4 local_60;
  tagged_union<int,_double,_debugger_type> *local_58;
  undefined8 *local_50;
  undefined8 local_48;
  type_id id;
  tagged_union<int,_double,_debugger_type> *b_local;
  tagged_union<int,_double,_debugger_type> *a_local;
  int *param_1_local;
  visitor *this_local;
  
  local_48 = 1;
  local_50 = &local_48;
  _tmp = 
  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/detail/variant_impl.hpp"
  ;
  local_60 = 0x8b;
  local_58 = a;
  id.
  super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>.
  value_ = (strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
            )(strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
              )b;
  lhs = (equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id> *)
        tagged_union<int,_double,_debugger_type>::type(b);
  bVar2 = strong_typedef_op::operator==
                    (lhs,(equality_comparison<type_safe::tagged_union<int,_double,_debugger_type>::type_id>
                          *)&local_48);
  if (bVar2) {
    union_type<int>::union_type(local_6b);
    piVar3 = tagged_union<int,_double,_debugger_type>::value<int>(a);
    tVar1 = id;
    union_type<int>::union_type(&local_6c);
    __b = tagged_union<int,_double,_debugger_type>::value<int>
                    ((tagged_union<int,_double,_debugger_type> *)
                     tVar1.
                     super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
                     .value_);
    std::swap<int>(piVar3,__b);
  }
  else {
    union_type<int>::union_type(&local_71);
    piVar3 = tagged_union<int,_double,_debugger_type>::value<int>(a);
    local_70 = *piVar3;
    move_assign_union_value<type_safe::optional_variant_policy,_type_safe::tagged_union<int,_double,_debugger_type>_>
    ::assign(a,(tagged_union<int,_double,_debugger_type> *)
               id.
               super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
               .value_);
    union_type<int>::union_type(&local_72);
    optional_variant_policy::change_value<int,int,double,debugger_type,int>
              (id.
               super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
               .value_,&local_70);
  }
  return;
}

Assistant:

void operator()(T&, Union& a, Union& b)
            {
                constexpr auto id = typename Union::type_id(union_type<T>{});
                DEBUG_ASSERT(a.type() == id, detail::assert_handler{});

                if (b.type() == id)
                {
                    using std::swap;
                    swap(a.value(union_type<T>{}), b.value(union_type<T>{}));
                }
                else
                {
                    T tmp(std::move(a).value(union_type<T>{})); // save old value from a
                    // assign a to value in b
                    move_assign_union_value<VariantPolicy, Union>::assign(a, std::move(b));
                    // change value in b to tmp
                    VariantPolicy::change_value(union_type<T>{}, b, std::move(tmp));
                }
            }